

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void visualizeClassicSudoku(SudokuGitter *gitter)

{
  ClassicSudokuVisualizer visualizer;
  allocator local_99;
  string local_98;
  SudokuGitter local_78;
  ClassicSudokuVisualizer local_50;
  
  SudokuGitter::SudokuGitter(&local_78,gitter);
  ClassicSudokuVisualizer::ClassicSudokuVisualizer(&local_50,&local_78);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_78.cells);
  std::__cxx11::string::string((string *)&local_98,"output/classic.html",&local_99);
  ClassicSudokuVisualizer::createHTML(&local_50,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  ClassicSudokuVisualizer::~ClassicSudokuVisualizer(&local_50);
  return;
}

Assistant:

void visualizeClassicSudoku(SudokuGitter gitter){
    ClassicSudokuVisualizer visualizer = ClassicSudokuVisualizer(gitter);
    visualizer.createHTML("output/classic.html");
}